

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::SplitConstructorCallCommon
          (Inline *this,Instr *newObjInstr,Opnd *lastArgOpnd,OpCode newObjOpCode,bool isInlined,
          bool isFixed,Instr **createObjInstrOut,Instr **callCtorInstrOut)

{
  undefined1 *puVar1;
  ushort profiledCallSiteId;
  Func *func;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ValueType valueType;
  undefined4 *puVar7;
  ProfiledInstr *pPVar8;
  JITTimeConstructorCache *this_00;
  FixedFieldInfo *this_01;
  intptr_t iVar9;
  intptr_t iVar10;
  AddrOpnd *pAVar11;
  StackSym *sym;
  SymOpnd *dstOpnd;
  Instr *pIVar12;
  Instr *instr;
  Instr *pIVar13;
  OpCode OVar14;
  ProfiledInstr *local_58;
  AddrOpnd *local_38;
  
  if (newObjInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1123,"(newObjInstr)","newObjInstr");
    if (!bVar3) goto LAB_0050c76d;
    *puVar7 = 0;
  }
  if (newObjInstr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1124,"(newObjInstr->GetSrc1())","newObjInstr->GetSrc1()");
    if (!bVar3) goto LAB_0050c76d;
    *puVar7 = 0;
  }
  if (lastArgOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1125,"(lastArgOpnd)","lastArgOpnd");
    if (!bVar3) goto LAB_0050c76d;
    *puVar7 = 0;
  }
  if (!isInlined && !isFixed) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1126,"(isInlined || isFixed)","isInlined || isFixed");
    if (!bVar3) goto LAB_0050c76d;
    *puVar7 = 0;
  }
  func = newObjInstr->m_func;
  if (newObjInstr->m_kind == InstrKindProfiled) {
    pPVar8 = IR::Instr::AsProfiledInstr(newObjInstr);
    profiledCallSiteId = (pPVar8->u).field_3.fldInfoData.f1;
    this_00 = Func::GetConstructorCache(newObjInstr->m_func,profiledCallSiteId);
    bVar3 = this_00 == (JITTimeConstructorCache *)0x0;
    if (bVar3) {
      bVar4 = false;
LAB_0050c43d:
      local_38 = (AddrOpnd *)IR::RegOpnd::New(TyVar,func);
      local_58 = IR::ProfiledInstr::New(newObjOpCode,(Opnd *)local_38,newObjInstr->m_src1,func);
      pPVar8 = IR::Instr::AsProfiledInstr(&local_58->super_Instr);
      *(uint *)&pPVar8->u = (uint)profiledCallSiteId;
      goto LAB_0050c472;
    }
    bVar4 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(this_00);
    bVar5 = JITTimeConstructorCache::SkipNewScObject(this_00);
    if (!bVar5) goto LAB_0050c43d;
    if (isInlined) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x1149,"(!isInlined || !skipNewScObj)","!isInlined || !skipNewScObj");
      if (!bVar3) goto LAB_0050c76d;
      *puVar7 = 0;
    }
    if (!isFixed) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x114a,"(isFixed || !skipNewScObj)","isFixed || !skipNewScObj");
      if (!bVar3) goto LAB_0050c76d;
      *puVar7 = 0;
    }
    this_01 = IR::Instr::GetFixedFunction(newObjInstr);
    iVar9 = FixedFieldInfo::GetFuncInfoAddr(this_01);
    iVar10 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                       (this->topFunc->m_threadContextInfo);
    if ((iVar9 == iVar10) ||
       (iVar10 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                           (this->topFunc->m_threadContextInfo), iVar9 == iVar10)) {
      bVar3 = false;
      bVar6 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)0x0);
      bVar5 = true;
      local_38 = (AddrOpnd *)0x0;
      if (bVar6) {
        return false;
      }
    }
    else {
      bVar5 = true;
      bVar3 = false;
      local_38 = (AddrOpnd *)0x0;
    }
LAB_0050c4c6:
    pAVar11 = IR::AddrOpnd::NewNull(newObjInstr->m_func);
    local_58 = (ProfiledInstr *)0x0;
  }
  else {
    local_38 = (AddrOpnd *)IR::RegOpnd::New(TyVar,func);
    local_58 = (ProfiledInstr *)
               IR::Instr::New(newObjOpCode,(Opnd *)local_38,newObjInstr->m_src1,func);
    bVar3 = true;
    bVar4 = false;
LAB_0050c472:
    if (local_58 == (ProfiledInstr *)0x0) {
      bVar5 = false;
      goto LAB_0050c4c6;
    }
    IR::Instr::SetByteCodeOffset(&local_58->super_Instr,newObjInstr);
    IR::Opnd::SetIsJITOptimizedReg((local_58->super_Instr).m_src1,true);
    puVar1 = &(local_58->super_Instr).field_0x37;
    *puVar1 = *puVar1 | 2;
    IR::Instr::InsertBefore(newObjInstr,&local_58->super_Instr);
    bVar5 = false;
    valueType = ValueType::GetObject(UninitializedObject);
    IR::Opnd::SetValueType(&local_38->super_Opnd,valueType);
    pAVar11 = local_38;
  }
  sym = SymTable::GetArgSlotSym(func->m_symTable,1);
  dstOpnd = IR::SymOpnd::New(&sym->super_Sym,TyVar,func);
  pIVar12 = IR::Instr::New(ArgOut_A,&dstOpnd->super_Opnd,&pAVar11->super_Opnd,lastArgOpnd,func);
  IR::Instr::SetByteCodeOffset(pIVar12,newObjInstr);
  IR::Opnd::SetIsJITOptimizedReg(pIVar12->m_dst,true);
  IR::Opnd::SetIsJITOptimizedReg(pIVar12->m_src2,true);
  IR::Instr::InsertBefore(newObjInstr,pIVar12);
  OVar14 = CallI;
  if (isFixed) {
    OVar14 = CallIFixed;
  }
  newObjInstr->m_opcode = OVar14;
  newObjInstr->field_0x37 = newObjInstr->field_0x37 | 0x20;
  if (newObjInstr->m_src2 != (Opnd *)0x0) {
    IR::Instr::FreeSrc2(newObjInstr);
  }
  IR::Instr::SetSrc2(newObjInstr,&dstOpnd->super_Opnd);
  pIVar12 = newObjInstr->m_next;
  if (pIVar12 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1188,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar6) goto LAB_0050c76d;
    *puVar7 = 0;
  }
  instr = IR::Instr::GetNextRealInstrOrLabel(newObjInstr);
  if (bVar4 == false) {
    if (bVar5) goto LAB_0050c6c9;
    pAVar11 = (AddrOpnd *)newObjInstr->m_dst;
    if (local_38 == pAVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x1198,"(createObjDst != newObjInstr->GetDst())",
                         "createObjDst != newObjInstr->GetDst()");
      if (!bVar4) {
LAB_0050c76d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      pAVar11 = (AddrOpnd *)newObjInstr->m_dst;
    }
    IR::Opnd::SetValueType(&pAVar11->super_Opnd,(ValueType)0x9);
    pIVar13 = IR::Instr::New(GetNewScObject,newObjInstr->m_dst,newObjInstr->m_dst,
                             &local_38->super_Opnd,func);
  }
  else {
    pIVar13 = IR::Instr::New(Ld_A,newObjInstr->m_dst,&local_38->super_Opnd,func);
  }
  IR::Instr::SetByteCodeOffset(pIVar13,instr);
  IR::Opnd::SetIsJITOptimizedReg(pIVar13->m_dst,true);
  IR::Opnd::SetIsJITOptimizedReg(pIVar13->m_src1,true);
  IR::Instr::InsertBefore(pIVar12,pIVar13);
LAB_0050c6c9:
  if (bVar3) {
    pIVar13 = IR::Instr::New(UpdateNewScObjectCache,func);
    IR::Instr::SetSrc1(pIVar13,newObjInstr->m_src1);
    IR::Instr::SetSrc2(pIVar13,newObjInstr->m_dst);
    IR::Instr::SetByteCodeOffset(pIVar13,instr);
    IR::Opnd::SetIsJITOptimizedReg(pIVar13->m_src1,true);
    IR::Opnd::SetIsJITOptimizedReg(pIVar13->m_src2,true);
    IR::Instr::InsertBefore(pIVar12,pIVar13);
  }
  if (createObjInstrOut != (Instr **)0x0) {
    *createObjInstrOut = &local_58->super_Instr;
  }
  if (callCtorInstrOut != (Instr **)0x0) {
    *callCtorInstrOut = newObjInstr;
  }
  return true;
}

Assistant:

bool
Inline::SplitConstructorCallCommon(
    IR::Instr *const newObjInstr,
    IR::Opnd *const lastArgOpnd,
    const Js::OpCode newObjOpCode,
    const bool isInlined,
    const bool isFixed,
    IR::Instr** createObjInstrOut,
    IR::Instr** callCtorInstrOut) const
{
    Assert(newObjInstr);
    Assert(newObjInstr->GetSrc1());
    Assert(lastArgOpnd);
    Assert(isInlined || isFixed);

    const auto callerFunc = newObjInstr->m_func;

    // Call the NoCtor version of NewScObject

    // Use a temporary register for the newly allocated object (before the call to ctor) - even if we know we'll return this
    // object from the whole operation.  That's so that we don't trash the bytecode register if we need to bail out at
    // object allocation (bytecode instruction has the form [Profiled]NewScObject R6 = R6).
    IR::RegOpnd* createObjDst = nullptr;
    IR::Instr* createObjInstr = nullptr;
    const JITTimeConstructorCache* constructorCache;
    bool returnCreatedObject = false;
    bool skipNewScObj = false;

    if (newObjInstr->IsProfiledInstr())
    {
        Js::ProfileId profiledCallSiteId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);
        constructorCache = newObjInstr->m_func->GetConstructorCache(profiledCallSiteId);
        returnCreatedObject = constructorCache != nullptr && constructorCache->CtorHasNoExplicitReturnValue();
        skipNewScObj = constructorCache != nullptr && constructorCache->SkipNewScObject();
        if (!skipNewScObj)
        {
            createObjDst = IR::RegOpnd::New(TyVar, callerFunc);
            createObjInstr = IR::ProfiledInstr::New(newObjOpCode, createObjDst, newObjInstr->GetSrc1(), callerFunc);
            createObjInstr->AsProfiledInstr()->u.profileId = profiledCallSiteId;
        }
    }
    else
    {
        constructorCache = nullptr;
        createObjDst = IR::RegOpnd::New(TyVar, callerFunc);
        createObjInstr = IR::Instr::New(newObjOpCode, createObjDst, newObjInstr->GetSrc1(), callerFunc);
    }

    Assert(!isInlined || !skipNewScObj);
    Assert(isFixed || !skipNewScObj);

    // For new Object() and new Array() we have special fast helpers.  We'll let the lowerer convert this instruction directly
    // into a call to one of these helpers.
    if (skipNewScObj)
    {
        FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();
        intptr_t ctorInfo = ctor->GetFuncInfoAddr();
        if ((ctorInfo == topFunc->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr() ||
            ctorInfo == topFunc->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr()) &&
            newObjInstr->HasEmptyArgOutChain())
        {
            return false;
        }
    }

    IR::Opnd* thisPtrOpnd;
    if (createObjInstr != nullptr)
    {
        createObjInstr->SetByteCodeOffset(newObjInstr);
        createObjInstr->GetSrc1()->SetIsJITOptimizedReg(true);
        // We're splitting a single byte code, so the interpreter has to resume from the beginning if we bail out.
        createObjInstr->forcePreOpBailOutIfNeeded = true;
        newObjInstr->InsertBefore(createObjInstr);

        createObjDst->SetValueType(ValueType::GetObject(ObjectType::UninitializedObject));
        thisPtrOpnd = createObjDst;
    }
    else
    {
        thisPtrOpnd = IR::AddrOpnd::NewNull(newObjInstr->m_func);
    }

    // Pass the new object to the constructor function with an ArgOut
    const auto thisArgOpnd = IR::SymOpnd::New(callerFunc->m_symTable->GetArgSlotSym(1), TyVar, callerFunc);
    auto instr = IR::Instr::New(Js::OpCode::ArgOut_A, thisArgOpnd, thisPtrOpnd, lastArgOpnd, callerFunc);
    instr->SetByteCodeOffset(newObjInstr);
    instr->GetDst()->SetIsJITOptimizedReg(true);
    instr->GetSrc2()->SetIsJITOptimizedReg(true);
    newObjInstr->InsertBefore(instr);

    // Call the constructor using CallI with isCtorCall set.  If we inline the constructor, and the inlined constructor
    // bails out, the interpreter would be entered with CallFlags_Value as well. If the interpreter starts using the
    // call flags, the proper call flags will need to be specified here by using a different op code specific to constructors.
    if (isFixed)
    {
        newObjInstr->m_opcode = Js::OpCode::CallIFixed;
    }
    else
    {
        newObjInstr->m_opcode = Js::OpCode::CallI;
    }

    newObjInstr->isCtorCall = true;

    if(newObjInstr->GetSrc2())
    {
        newObjInstr->FreeSrc2();
    }
    newObjInstr->SetSrc2(thisArgOpnd);

    const auto insertBeforeInstr = newObjInstr->m_next;
    Assert(insertBeforeInstr);
    const auto nextByteCodeOffsetInstr = newObjInstr->GetNextRealInstrOrLabel();

    // Determine which object to use as the final result of NewScObject, the object passed into the constructor as 'this', or
    // the object returned by the constructor.  We only need this if we don't have a hard-coded constructor cache, or if the
    // constructor returns something explicitly.  Otherwise, we simply return the object we allocated and passed to the constructor.
    if (returnCreatedObject)
    {
        instr = IR::Instr::New(Js::OpCode::Ld_A, newObjInstr->GetDst(), createObjDst, callerFunc);
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetDst()->SetIsJITOptimizedReg(true);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }
    else if (!skipNewScObj)
    {
        Assert(createObjDst != newObjInstr->GetDst());

        // Since we're not returning the default new object, the constructor must be returning something explicitly.  We don't
        // know at this point whether it's an object or not.  If the constructor is later inlined, the value type will be determined
        // from the flow in glob opt.  Otherwise, we'll need to emit an object check.
        newObjInstr->GetDst()->SetValueType(ValueType::Uninitialized);

        instr = IR::Instr::New(Js::OpCode::GetNewScObject, newObjInstr->GetDst(), newObjInstr->GetDst(), createObjDst, callerFunc);
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetDst()->SetIsJITOptimizedReg(true);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }

    // Update the NewScObject cache, but only if we don't have a hard-coded constructor cache.  We only clone caches that
    // don't require update, and once updated a cache never requires an update again.
    if (constructorCache == nullptr)
    {
        instr = IR::Instr::New(Js::OpCode::UpdateNewScObjectCache, callerFunc);
        instr->SetSrc1(newObjInstr->GetSrc1()); // constructor function
        instr->SetSrc2(newObjInstr->GetDst());  // the new object
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        instr->GetSrc2()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }

    if (createObjInstrOut != nullptr)
    {
        *createObjInstrOut = createObjInstr;
    }

    if (callCtorInstrOut != nullptr)
    {
        *callCtorInstrOut = newObjInstr;
    }

    return true;
}